

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t google::protobuf::internal::(anonymous_namespace)::
       SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue_const*>
                 (KeyValue *it_dest,KeyValue *end_dest,KeyValue *it_source,KeyValue *end_source)

{
  bool bVar1;
  byte local_32;
  size_t local_30;
  size_t result;
  KeyValue *end_source_local;
  KeyValue *it_source_local;
  KeyValue *end_dest_local;
  KeyValue *it_dest_local;
  
  local_30 = std::distance<google::protobuf::internal::ExtensionSet::KeyValue*>(it_dest,end_dest);
  end_dest_local = it_dest;
  for (end_source_local = it_source; end_source_local != end_source;
      end_source_local = end_source_local + 1) {
    while( true ) {
      bVar1 = false;
      if (end_dest_local != end_dest) {
        bVar1 = end_dest_local->first < end_source_local->first;
      }
      if (!bVar1) break;
      end_dest_local = end_dest_local + 1;
    }
    if ((end_dest_local == end_dest) ||
       (local_32 = 0, end_source_local->first < end_dest_local->first)) {
      local_32 = (byte)(end_source_local->second).field_0xa >> 1 & 1 ^ 0xff;
    }
    local_30 = (local_32 & 1) + local_30;
  }
  return local_30;
}

Assistant:

size_t SizeOfUnion(ItX it_dest, ItX end_dest, ItY it_source, ItY end_source) {
  size_t result = std::distance(it_dest, end_dest);
  for (; it_source != end_source; ++it_source) {
    while (it_dest != end_dest && it_dest->first < it_source->first) {
      ++it_dest;
    }
    result += (it_dest == end_dest || it_dest->first > it_source->first) &&
              !it_source->second.is_cleared;
  }
  return result;
}